

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClientTimingLog.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
ViconDataStreamSDK::Core::VClientTimingLog::LogHeadings_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VClientTimingLog *this,
          vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
          *i_rSamples)

{
  pointer pVVar1;
  VLatencyInfo_Sample *rLatency;
  pointer __x;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar1 = (i_rSamples->
           super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (i_rSamples->
             super__Vector_base<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pVVar1; __x = __x + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&__x->m_Name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< std::string > VClientTimingLog::LogHeadings(const std::vector< ViconCGStreamDetail::VLatencyInfo_Sample > & i_rSamples ) const
{
  std::vector< std::string > Headings;
  for (const auto& rLatency : i_rSamples)
  {
    Headings.push_back( rLatency.m_Name );
  }
  return Headings;
}